

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LuaException.h
# Opt level: O0

void __thiscall luabridge::LuaException::~LuaException(LuaException *this)

{
  LuaException *this_local;
  
  ~LuaException(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~LuaException() throw() {}